

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
::erase_from_leaf_node
          (btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
           *this,iterator _begin,size_type to_erase)

{
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_> bVar1
  ;
  ulong uVar2;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar3;
  slot_type *dest;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar4;
  long lVar5;
  iterator iVar6;
  
  pbVar3 = _begin.node;
  if (((undefined1  [16])_begin & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (pbVar3[0xb] ==
      (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>)
      0x0) {
    __assert_fail("node->leaf()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb03,
                  "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = pbVar3[10];
  uVar2 = (ulong)(byte)bVar1;
  if ((int)(uint)(byte)bVar1 <= _begin.position) {
    __assert_fail("node->count() > _begin.position",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xb04,
                  "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  lVar5 = (long)_begin.position;
  if (lVar5 + to_erase <= uVar2) {
    pbVar4 = pbVar3 + lVar5 * 4 + 0xc;
    if (pbVar4 + to_erase * 4 != pbVar3 + uVar2 * 4 + 0xc) {
      lVar5 = uVar2 * 4 + lVar5 * -4;
      do {
        *(undefined4 *)pbVar4 = *(undefined4 *)(pbVar4 + to_erase * 4);
        pbVar4 = pbVar4 + 4;
        lVar5 = lVar5 + -4;
      } while (to_erase * 4 - lVar5 != 0);
      bVar1 = pbVar3[10];
    }
    pbVar3[10] = (btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>
                  )((char)bVar1 - (char)to_erase);
    this->size_ = this->size_ - to_erase;
    iVar6 = rebalance_after_delete(this,_begin);
    return iVar6;
  }
  __assert_fail("_begin.position + to_erase <= node->count()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0xb05,
                "iterator phmap::priv::btree<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>]"
               );
}

Assistant:

auto btree<P>::erase_from_leaf_node(iterator _begin, size_type to_erase)
        -> iterator {
        node_type *node = _begin.node;
        assert(node->leaf());
        assert(node->count() > _begin.position);
        assert(_begin.position + to_erase <= node->count());

        node->remove_values_ignore_children(_begin.position, to_erase,
                                            mutable_allocator());

        size_ -= to_erase;

        return rebalance_after_delete(_begin);
    }